

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O2

_Bool ssh2_common_filter_queue(PacketProtocolLayer *ppl)

{
  PktInQueue *pPVar1;
  LogContext *ctx;
  Ssh *ssh;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  PktIn *pPVar5;
  char *pcVar6;
  unsigned_long uVar7;
  BinarySource *src;
  ptrlen pVar8;
  ptrlen algname;
  int local_48;
  ptrlen extvalue;
  
  while( true ) {
    pPVar1 = ppl->in_pq;
    pPVar5 = (*pPVar1->after)(&pPVar1->pqb,(PacketQueueNode *)pPVar1,false);
    if (pPVar5 == (PktIn *)0x0) break;
    switch(pPVar5->type) {
    case 1:
      uVar7 = BinarySource_get_uint32(pPVar5->binarysource_);
      pVar8 = BinarySource_get_string(pPVar5->binarysource_);
      ssh = ppl->ssh;
      iVar4 = (int)uVar7;
      if ((ulong)(long)iVar4 < 0x10 && 0 < iVar4) {
        pcVar6 = ssh2_common_filter_queue::ssh2_disconnect_reasons[iVar4];
      }
      else {
        pcVar6 = "unknown";
      }
      uVar3 = string_length_for_printf(pVar8.len);
      ssh_remote_error(ssh,"Remote side sent disconnect message\ntype %d (%s):\n\"%.*s\"",
                       uVar7 & 0xffffffff,pcVar6,(ulong)uVar3,pVar8.ptr);
      return true;
    case 2:
      break;
    default:
      goto switchD_00129978_caseD_3;
    case 4:
      BinarySource_get_bool(pPVar5->binarysource_);
      pVar8 = BinarySource_get_string(pPVar5->binarysource_);
      ctx = ppl->logctx;
      uVar3 = string_length_for_printf(pVar8.len);
      pcVar6 = dupprintf("Remote debug message: %.*s",(ulong)uVar3,pVar8.ptr);
      logevent_and_free(ctx,pcVar6);
      break;
    case 7:
      src = pPVar5->binarysource_;
      uVar7 = BinarySource_get_uint32(src);
      iVar4 = 0;
      while ((local_48 = (int)uVar7, iVar4 != local_48 &&
             (pPVar5->binarysource_[0].err == BSE_NO_ERROR))) {
        pVar8 = BinarySource_get_string(src);
        extvalue = BinarySource_get_string(src);
        _Var2 = ptrlen_eq_string(pVar8,"server-sig-algs");
        if (_Var2) {
          while (_Var2 = get_commasep_word(&extvalue,&algname), _Var2) {
            _Var2 = ptrlen_eq_string(algname,"rsa-sha2-256");
            if (_Var2) {
              ppl->bpp->ext_info_rsa_sha256_ok = true;
            }
            _Var2 = ptrlen_eq_string(algname,"rsa-sha2-512");
            if (_Var2) {
              ppl->bpp->ext_info_rsa_sha512_ok = true;
            }
          }
        }
        iVar4 = iVar4 + 1;
      }
    }
    pPVar1 = ppl->in_pq;
    (*pPVar1->after)(&pPVar1->pqb,(PacketQueueNode *)pPVar1,true);
  }
switchD_00129978_caseD_3:
  return false;
}

Assistant:

bool ssh2_common_filter_queue(PacketProtocolLayer *ppl)
{
    static const char *const ssh2_disconnect_reasons[] = {
        NULL,
        "host not allowed to connect",
        "protocol error",
        "key exchange failed",
        "host authentication failed",
        "MAC error",
        "compression error",
        "service not available",
        "protocol version not supported",
        "host key not verifiable",
        "connection lost",
        "by application",
        "too many connections",
        "auth cancelled by user",
        "no more auth methods available",
        "illegal user name",
    };

    PktIn *pktin;
    ptrlen msg;
    int reason;

    while ((pktin = pq_peek(ppl->in_pq)) != NULL) {
        switch (pktin->type) {
          case SSH2_MSG_DISCONNECT:
            reason = get_uint32(pktin);
            msg = get_string(pktin);

            ssh_remote_error(
                ppl->ssh, "Remote side sent disconnect message\n"
                "type %d (%s):\n\"%.*s\"", reason,
                ((reason > 0 && reason < lenof(ssh2_disconnect_reasons)) ?
                 ssh2_disconnect_reasons[reason] : "unknown"),
                PTRLEN_PRINTF(msg));
            /* don't try to pop the queue, because we've been freed! */
            return true;               /* indicate that we've been freed */

          case SSH2_MSG_DEBUG:
            /* XXX maybe we should actually take notice of the return value */
            get_bool(pktin);
            msg = get_string(pktin);
            ppl_logevent("Remote debug message: %.*s", PTRLEN_PRINTF(msg));
            pq_pop(ppl->in_pq);
            break;

          case SSH2_MSG_IGNORE:
            /* Do nothing, because we're ignoring it! Duhh. */
            pq_pop(ppl->in_pq);
            break;

          case SSH2_MSG_EXT_INFO: {
            /*
             * The BPP enforces that these turn up only at legal
             * points in the protocol. In particular, it will not pass
             * an EXT_INFO on to us if it arrives before encryption is
             * enabled (which is when a MITM could inject one
             * maliciously).
             *
             * However, one of the criteria for legality is that a
             * server is permitted to send this message immediately
             * _before_ USERAUTH_SUCCESS. So we may receive this
             * message not yet knowing whether it's legal to have sent
             * it - we won't know until the BPP processes the next
             * packet.
             *
             * But that should be OK, because firstly, an
             * out-of-sequence EXT_INFO that's still within the
             * encrypted session is only a _protocol_ violation, not
             * an attack; secondly, any data we set in response to
             * such an illegal EXT_INFO won't have a chance to affect
             * the session before the BPP aborts it anyway.
             */
            uint32_t nexts = get_uint32(pktin);
            for (uint32_t i = 0; i < nexts && !get_err(pktin); i++) {
                ptrlen extname = get_string(pktin);
                ptrlen extvalue = get_string(pktin);
                if (ptrlen_eq_string(extname, "server-sig-algs")) {
                    /*
                     * Server has sent a list of signature algorithms
                     * it will potentially accept for user
                     * authentication keys. Check in particular
                     * whether the RFC 8332 improved versions of
                     * ssh-rsa are in the list, and set flags in the
                     * BPP if so.
                     *
                     * TODO: another thing we _could_ do here is to
                     * record a full list of the algorithm identifiers
                     * we've seen, whether we understand them
                     * ourselves or not. Then we could use that as a
                     * pre-filter during userauth, to skip keys in the
                     * SSH agent if we already know the server can't
                     * possibly accept them. (Even if the key
                     * algorithm is one that the agent and the server
                     * both understand but we do not.)
                     */
                    ptrlen algname;
                    while (get_commasep_word(&extvalue, &algname)) {
                        if (ptrlen_eq_string(algname, "rsa-sha2-256"))
                            ppl->bpp->ext_info_rsa_sha256_ok = true;
                        if (ptrlen_eq_string(algname, "rsa-sha2-512"))
                            ppl->bpp->ext_info_rsa_sha512_ok = true;
                    }
                }
            }
            pq_pop(ppl->in_pq);
            break;
          }

          default:
            return false;
        }
    }

    return false;
}